

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

void highbd_resize_multistep
               (uint16_t *input,int length,uint16_t *output,int olength,uint16_t *otmp,int bd)

{
  int iVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  int iVar10;
  uint16_t *puVar11;
  uint16_t *puVar12;
  uint16_t *puVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint16_t *puVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint16_t *puVar21;
  uint uVar22;
  ushort *puVar23;
  uint16_t uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  ushort *puVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  
  if (length == olength) {
    memcpy(output,input,(long)length * 2);
    return;
  }
  uVar22 = 0;
  iVar10 = length;
  do {
    iVar10 = iVar10 + 1 >> 1;
    if (iVar10 < olength) break;
    uVar22 = uVar22 + 1;
  } while (iVar10 != 1);
  if (0 < (int)uVar22) {
    iVar10 = length + 1;
    puVar11 = (uint16_t *)0x0;
    uVar26 = 0;
    uVar18 = (ulong)(uint)length;
    do {
      iVar1 = (int)uVar18;
      length = iVar1 + 1 >> 1;
      puVar21 = puVar11;
      if (uVar26 == 0) {
        puVar21 = input;
      }
      puVar11 = otmp + (int)(-(uVar26 & 1) & iVar10 >> 1);
      if (length == olength && uVar26 == uVar22 - 1) {
        puVar11 = output;
      }
      if ((uVar18 & 1) == 0) {
        if (iVar1 < 8) {
          if (0 < iVar1) {
            iVar14 = 1;
            uVar16 = 0;
            puVar13 = puVar11;
            do {
              iVar25 = 0x40;
              uVar31 = uVar16 & 0xffffffff;
              lVar27 = 0;
              iVar19 = iVar14;
              do {
                uVar32 = 0;
                if (0 < (int)uVar31) {
                  uVar32 = uVar31;
                }
                iVar30 = iVar1 + -1;
                if (iVar19 < iVar1 + -1) {
                  iVar30 = iVar19;
                }
                iVar25 = iVar25 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar27) *
                                  ((uint)puVar21[iVar30] + (uint)puVar21[uVar32]);
                lVar27 = lVar27 + 2;
                iVar19 = iVar19 + 1;
                uVar31 = (ulong)((int)uVar31 - 1);
              } while (lVar27 != 8);
              if (bd == 10) {
                iVar19 = 0x3ff;
              }
              else if (bd == 0xc) {
                iVar19 = 0xfff;
              }
              else {
                iVar19 = 0xff;
              }
              iVar30 = iVar25 >> 7;
              if (iVar19 <= iVar25 >> 7) {
                iVar30 = iVar19;
              }
              uVar24 = (uint16_t)iVar30;
              if (iVar30 < 1) {
                uVar24 = 0;
              }
              *puVar13 = uVar24;
              puVar13 = puVar13 + 1;
              uVar16 = uVar16 + 2;
              iVar14 = iVar14 + 2;
            } while (uVar16 < uVar18);
          }
        }
        else {
          puVar13 = puVar11;
          puVar17 = puVar21 + 1;
          uVar18 = 0;
          do {
            puVar12 = puVar13;
            iVar14 = 0x40;
            uVar16 = uVar18 & 0xffffffff;
            lVar27 = 0;
            do {
              uVar31 = 0;
              if (0 < (int)uVar16) {
                uVar31 = uVar16;
              }
              iVar14 = iVar14 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar27) *
                                ((uint)*(ushort *)((long)puVar17 + lVar27) + (uint)puVar21[uVar31]);
              lVar27 = lVar27 + 2;
              uVar16 = (ulong)((int)uVar16 - 1);
            } while (lVar27 != 8);
            if (bd == 10) {
              iVar19 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar19 = 0xfff;
            }
            else {
              iVar19 = 0xff;
            }
            iVar25 = iVar14 >> 7;
            if (iVar19 <= iVar14 >> 7) {
              iVar25 = iVar19;
            }
            uVar24 = (uint16_t)iVar25;
            if (iVar25 < 1) {
              uVar24 = 0;
            }
            *puVar12 = uVar24;
            puVar13 = puVar12 + 1;
            puVar17 = puVar17 + 2;
            bVar33 = uVar18 == 0;
            uVar18 = uVar18 + 2;
          } while (bVar33);
          uVar18 = 4;
          if (iVar1 - 4U != 4) {
            uVar18 = 4;
            do {
              uVar16 = uVar18;
              uVar18 = *(ulong *)(puVar21 + 1 + uVar16);
              auVar2._8_4_ = 0;
              auVar2._0_8_ = uVar18;
              auVar2._12_2_ = (short)(uVar18 >> 0x30);
              auVar4._8_2_ = (short)(uVar18 >> 0x20);
              auVar4._0_8_ = uVar18;
              auVar4._10_4_ = auVar2._10_4_;
              auVar8._6_8_ = 0;
              auVar8._0_6_ = auVar4._8_6_;
              auVar6._4_2_ = (short)(uVar18 >> 0x10);
              auVar6._0_4_ = (uint)uVar18;
              auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(puVar21 + (uVar16 - 3));
              auVar34 = pshuflw(auVar34,auVar34,0x1b);
              auVar3._10_2_ = 0;
              auVar3._0_10_ = auVar34._0_10_;
              auVar3._12_2_ = auVar34._6_2_;
              auVar5._8_2_ = auVar34._4_2_;
              auVar5._0_8_ = auVar34._0_8_;
              auVar5._10_4_ = auVar3._10_4_;
              auVar9._6_8_ = 0;
              auVar9._0_6_ = auVar5._8_6_;
              auVar7._4_2_ = auVar34._2_2_;
              auVar7._0_4_ = auVar34._0_4_;
              auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
              iVar14 = (int)(((auVar7._4_4_ + auVar6._4_4_) * 0xc -
                             ((auVar3._10_4_ >> 0x10) + (auVar2._10_4_ >> 0x10))) +
                            (auVar5._8_4_ + auVar4._8_4_) * -3 +
                            ((auVar34._0_4_ & 0xffff) + ((uint)uVar18 & 0xffff)) * 0x38 + 0x40) >> 7
              ;
              if (bd == 10) {
                if (0x3fe < iVar14) {
                  iVar14 = 0x3ff;
                }
              }
              else if (bd == 0xc) {
                if (0xffe < iVar14) {
                  iVar14 = 0xfff;
                }
              }
              else if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              *(short *)((long)puVar12 + (uVar16 - 2)) = (short)iVar14;
              uVar18 = uVar16 + 2;
            } while (uVar18 < iVar1 - 4U);
            puVar13 = (uint16_t *)((long)puVar13 + (uVar16 - 2));
          }
          if ((int)uVar18 < iVar1) {
            uVar16 = uVar18 & 0xffffffff;
            iVar14 = (int)uVar18 + 1;
            puVar23 = puVar21 + uVar16;
            do {
              iVar25 = 0x40;
              lVar27 = 0;
              puVar29 = puVar23;
              iVar19 = iVar14;
              do {
                iVar30 = iVar1 + -1;
                if (iVar19 < iVar1 + -1) {
                  iVar30 = iVar19;
                }
                iVar25 = iVar25 + (int)*(short *)((long)av1_down2_symeven_half_filter + lVar27) *
                                  ((uint)puVar21[iVar30] + (uint)*puVar29);
                lVar27 = lVar27 + 2;
                iVar19 = iVar19 + 1;
                puVar29 = puVar29 + -1;
              } while (lVar27 != 8);
              if (bd == 10) {
                iVar19 = 0x3ff;
              }
              else if (bd == 0xc) {
                iVar19 = 0xfff;
              }
              else {
                iVar19 = 0xff;
              }
              iVar30 = iVar25 >> 7;
              if (iVar19 <= iVar25 >> 7) {
                iVar30 = iVar19;
              }
              uVar24 = (uint16_t)iVar30;
              if (iVar30 < 1) {
                uVar24 = 0;
              }
              *puVar13 = uVar24;
              puVar13 = puVar13 + 1;
              uVar16 = uVar16 + 2;
              iVar14 = iVar14 + 2;
              puVar23 = puVar23 + 2;
            } while ((int)uVar16 < iVar1);
          }
        }
      }
      else if (iVar1 < 7) {
        if (0 < iVar1) {
          iVar14 = 1;
          uVar20 = 0xffffffff;
          uVar16 = 0;
          puVar13 = puVar11;
          do {
            iVar19 = (uint)puVar21[uVar16] * 0x40 + 0x40;
            lVar27 = 0;
            uVar15 = uVar20;
            do {
              uVar31 = 0;
              if (0 < (int)uVar15) {
                uVar31 = (ulong)uVar15;
              }
              iVar25 = iVar14 + (int)lVar27;
              if (iVar1 + -1 <= iVar25) {
                iVar25 = iVar1 + -1;
              }
              iVar19 = iVar19 + (int)av1_down2_symodd_half_filter[lVar27 + 1] *
                                ((uint)puVar21[iVar25] + (uint)puVar21[uVar31]);
              lVar27 = lVar27 + 1;
              uVar15 = uVar15 - 1;
            } while (lVar27 != 3);
            if (bd == 10) {
              iVar25 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar25 = 0xfff;
            }
            else {
              iVar25 = 0xff;
            }
            iVar30 = iVar19 >> 7;
            if (iVar25 <= iVar19 >> 7) {
              iVar30 = iVar25;
            }
            uVar24 = (uint16_t)iVar30;
            if (iVar30 < 1) {
              uVar24 = 0;
            }
            *puVar13 = uVar24;
            puVar13 = puVar13 + 1;
            uVar16 = uVar16 + 2;
            iVar14 = iVar14 + 2;
            uVar20 = uVar20 + 2;
          } while (uVar16 < uVar18);
        }
      }
      else {
        uVar20 = 0xffffffff;
        puVar13 = puVar11;
        puVar17 = puVar21;
        lVar27 = 0;
        do {
          iVar14 = (uint)puVar21[lVar27] * 0x40 + 0x40;
          lVar28 = 1;
          uVar15 = uVar20;
          do {
            uVar18 = 0;
            if (0 < (int)uVar15) {
              uVar18 = (ulong)uVar15;
            }
            iVar14 = iVar14 + (int)av1_down2_symodd_half_filter[lVar28] *
                              ((uint)puVar17[lVar28] + (uint)puVar21[uVar18]);
            lVar28 = lVar28 + 1;
            uVar15 = uVar15 - 1;
          } while (lVar28 != 4);
          if (bd == 10) {
            iVar19 = 0x3ff;
          }
          else if (bd == 0xc) {
            iVar19 = 0xfff;
          }
          else {
            iVar19 = 0xff;
          }
          iVar25 = iVar14 >> 7;
          if (iVar19 <= iVar14 >> 7) {
            iVar25 = iVar19;
          }
          uVar24 = (uint16_t)iVar25;
          if (iVar25 < 1) {
            uVar24 = 0;
          }
          *puVar13 = uVar24;
          puVar13 = puVar13 + 1;
          puVar17 = puVar17 + 2;
          uVar20 = uVar20 + 2;
          bVar33 = lVar27 == 0;
          lVar27 = lVar27 + 2;
        } while (bVar33);
        uVar18 = 4;
        if (iVar1 - 3U != 4) {
          uVar18 = 4;
          puVar17 = puVar21;
          do {
            iVar14 = (uint)puVar21[uVar18] * 0x40 + 0x40;
            lVar27 = 1;
            lVar28 = 6;
            do {
              iVar14 = iVar14 + (int)av1_down2_symodd_half_filter[lVar27] *
                                ((uint)puVar17[lVar27 + 4] +
                                (uint)*(ushort *)((long)puVar17 + lVar28));
              lVar27 = lVar27 + 1;
              lVar28 = lVar28 + -2;
            } while (lVar27 != 4);
            if (bd == 10) {
              iVar19 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar19 = 0xfff;
            }
            else {
              iVar19 = 0xff;
            }
            iVar25 = iVar14 >> 7;
            if (iVar19 <= iVar14 >> 7) {
              iVar25 = iVar19;
            }
            uVar24 = (uint16_t)iVar25;
            if (iVar25 < 1) {
              uVar24 = 0;
            }
            *puVar13 = uVar24;
            puVar13 = puVar13 + 1;
            uVar18 = uVar18 + 2;
            puVar17 = puVar17 + 2;
          } while (uVar18 < iVar1 - 3U);
        }
        if ((int)uVar18 < iVar1) {
          uVar18 = uVar18 & 0xffffffff;
          puVar23 = puVar21 + (uVar18 - 1);
          do {
            iVar14 = (uint)puVar21[uVar18] * 0x40 + 0x40;
            lVar27 = 1;
            puVar29 = puVar23;
            do {
              iVar19 = (int)uVar18 + (int)lVar27;
              if (iVar1 + -1 <= iVar19) {
                iVar19 = iVar1 + -1;
              }
              iVar14 = iVar14 + (int)av1_down2_symodd_half_filter[lVar27] *
                                ((uint)puVar21[iVar19] + (uint)*puVar29);
              lVar27 = lVar27 + 1;
              puVar29 = puVar29 + -1;
            } while (lVar27 != 4);
            if (bd == 10) {
              iVar19 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar19 = 0xfff;
            }
            else {
              iVar19 = 0xff;
            }
            iVar25 = iVar14 >> 7;
            if (iVar19 <= iVar14 >> 7) {
              iVar25 = iVar19;
            }
            uVar24 = (uint16_t)iVar25;
            if (iVar25 < 1) {
              uVar24 = 0;
            }
            *puVar13 = uVar24;
            puVar13 = puVar13 + 1;
            uVar18 = uVar18 + 2;
            puVar23 = puVar23 + 2;
          } while ((int)uVar18 < iVar1);
        }
      }
      uVar26 = uVar26 + 1;
      uVar18 = (ulong)(uint)length;
    } while (uVar26 != uVar22);
    input = puVar11;
    if (length == olength) {
      return;
    }
  }
  highbd_interpolate(input,length,output,olength,bd);
  return;
}

Assistant:

static void highbd_resize_multistep(const uint16_t *const input, int length,
                                    uint16_t *output, int olength,
                                    uint16_t *otmp, int bd) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint16_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint16_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint16_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        highbd_down2_symodd(in, filteredlength, out, bd);
      else
        highbd_down2_symeven(in, filteredlength, out, bd);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      highbd_interpolate(out, filteredlength, output, olength, bd);
    }
  } else {
    highbd_interpolate(input, length, output, olength, bd);
  }
}